

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinearRegression.cpp
# Opt level: O1

string * __thiscall
LinearRegression::generateParameters_abi_cxx11_
          (string *__return_storage_ptr__,LinearRegression *this)

{
  undefined8 *puVar1;
  var_bitset *this_00;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *this_01;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  long lVar3;
  bool bVar4;
  char cVar5;
  bool bVar6;
  long *plVar7;
  undefined8 *puVar8;
  ulong *puVar9;
  size_type *psVar10;
  long *plVar11;
  ulong *puVar12;
  ulong uVar13;
  unsigned_long uVar14;
  ulong uVar15;
  size_t sVar16;
  char cVar17;
  undefined8 uVar18;
  string __str;
  string __str_1;
  string initParam;
  string __str_3;
  string __str_2;
  string numOfParameters;
  string constructGrad;
  string constructParam;
  string *outString;
  string __str_4;
  ulong *local_3a0;
  long local_398;
  ulong local_390;
  long lStack_388;
  long *local_380;
  long local_378;
  long local_370;
  long lStack_368;
  string local_360;
  ulong *local_340;
  long local_338;
  ulong local_330;
  undefined8 uStack_328;
  ulong *local_320;
  long local_318;
  ulong local_310;
  undefined8 uStack_308;
  ulong *local_300;
  long local_2f8;
  ulong local_2f0;
  undefined8 uStack_2e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e0;
  string local_2c0;
  ulong *local_2a0;
  long local_298;
  ulong local_290;
  long lStack_288;
  ulong *local_280;
  long local_278;
  ulong local_270;
  long lStack_268;
  ulong *local_260;
  long local_258;
  ulong local_250;
  undefined8 uStack_248;
  ulong *local_240;
  long local_238;
  ulong local_230;
  undefined8 uStack_228;
  ulong *local_220;
  long local_218;
  ulong local_210;
  long lStack_208;
  ulong *local_200;
  long local_1f8;
  ulong local_1f0;
  long lStack_1e8;
  ulong *local_1e0;
  long local_1d8;
  ulong local_1d0;
  long lStack_1c8;
  ulong *local_1c0;
  long local_1b8;
  ulong local_1b0;
  undefined8 uStack_1a8;
  undefined8 *local_1a0;
  undefined8 local_198;
  undefined8 local_190;
  undefined8 uStack_188;
  string local_180;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  string local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  string *local_100;
  var_bitset *local_f8;
  ulong *local_f0;
  uint local_e8;
  undefined4 uStack_e4;
  ulong local_e0 [2];
  ulong *local_d0;
  long local_c8;
  ulong local_c0 [2];
  ulong *local_b0;
  long local_a8;
  ulong local_a0 [2];
  ulong *local_90;
  long local_88;
  ulong local_80 [2];
  ulong *local_70;
  long local_68;
  ulong local_60 [2];
  ulong *local_50;
  long local_48;
  ulong local_40 [2];
  
  this_01 = &this->_parameterIndex;
  local_100 = __return_storage_ptr__;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize(this_01,0x65);
  local_380 = &local_370;
  std::__cxx11::string::_M_construct((ulong)&local_380,'\x03');
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_380);
  local_2a0 = &local_290;
  puVar9 = (ulong *)(plVar7 + 2);
  if ((ulong *)*plVar7 == puVar9) {
    local_290 = *puVar9;
    lStack_288 = plVar7[3];
  }
  else {
    local_290 = *puVar9;
    local_2a0 = (ulong *)*plVar7;
  }
  local_298 = plVar7[1];
  *plVar7 = (long)puVar9;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  local_3a0 = &local_390;
  std::__cxx11::string::_M_construct((ulong)&local_3a0,'\x03');
  uVar15 = 0xf;
  if (local_2a0 != &local_290) {
    uVar15 = local_290;
  }
  if (uVar15 < (ulong)(local_398 + local_298)) {
    uVar15 = 0xf;
    if (local_3a0 != &local_390) {
      uVar15 = local_390;
    }
    if (uVar15 < (ulong)(local_398 + local_298)) goto LAB_0013504c;
    puVar8 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_3a0,0,(char *)0x0,(ulong)local_2a0);
  }
  else {
LAB_0013504c:
    puVar8 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_2a0,(ulong)local_3a0);
  }
  local_1a0 = &local_190;
  puVar1 = puVar8 + 2;
  if ((undefined8 *)*puVar8 == puVar1) {
    local_190 = *puVar1;
    uStack_188 = puVar8[3];
  }
  else {
    local_190 = *puVar1;
    local_1a0 = (undefined8 *)*puVar8;
  }
  local_198 = puVar8[1];
  *puVar8 = puVar1;
  puVar8[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_1a0);
  paVar2 = &local_160.field_2;
  psVar10 = (size_type *)(plVar7 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar10) {
    local_160.field_2._M_allocated_capacity = *psVar10;
    local_160.field_2._8_8_ = plVar7[3];
    local_160._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_160.field_2._M_allocated_capacity = *psVar10;
    local_160._M_dataplus._M_p = (pointer)*plVar7;
  }
  local_160._M_string_length = plVar7[1];
  *plVar7 = (long)psVar10;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_160);
  local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
  psVar10 = (size_type *)(plVar7 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar10) {
    local_120.field_2._M_allocated_capacity = *psVar10;
    local_120.field_2._8_8_ = plVar7[3];
  }
  else {
    local_120.field_2._M_allocated_capacity = *psVar10;
    local_120._M_dataplus._M_p = (pointer)*plVar7;
  }
  local_120._M_string_length = plVar7[1];
  *plVar7 = (long)psVar10;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160._M_dataplus._M_p != paVar2) {
    operator_delete(local_160._M_dataplus._M_p);
  }
  if (local_1a0 != &local_190) {
    operator_delete(local_1a0);
  }
  if (local_3a0 != &local_390) {
    operator_delete(local_3a0);
  }
  if (local_2a0 != &local_290) {
    operator_delete(local_2a0);
  }
  if (local_380 != &local_370) {
    operator_delete(local_380);
  }
  local_160._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_160,"");
  local_1a0 = &local_190;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a0,"numberOfParameters = ","");
  this_00 = &(this->super_Application)._features;
  local_f8 = &this->_categoricalFeatures;
  uVar14 = 1;
  sVar16 = 0;
  do {
    bVar6 = std::bitset<100UL>::test(this_00,sVar16);
    if (bVar6) {
      bVar6 = std::bitset<100UL>::test(local_f8,sVar16);
      if (bVar6) {
        uVar15 = **(ulong **)
                   &((*(this->parameterQueries[sVar16]->_aggregates).
                       super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>._M_impl.
                       super__Vector_impl_data._M_start)->_incoming).
                    super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                    ._M_impl.super__Vector_impl_data;
        cVar17 = '\x01';
        if (9 < uVar15) {
          uVar13 = uVar15;
          cVar5 = '\x04';
          do {
            cVar17 = cVar5;
            if (uVar13 < 100) {
              cVar17 = cVar17 + -2;
              goto LAB_001352fa;
            }
            if (uVar13 < 1000) {
              cVar17 = cVar17 + -1;
              goto LAB_001352fa;
            }
            if (uVar13 < 10000) goto LAB_001352fa;
            bVar6 = 99999 < uVar13;
            uVar13 = uVar13 / 10000;
            cVar5 = cVar17 + '\x04';
          } while (bVar6);
          cVar17 = cVar17 + '\x01';
        }
LAB_001352fa:
        local_3a0 = &local_390;
        std::__cxx11::string::_M_construct((ulong)&local_3a0,cVar17);
        std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_3a0,(uint)local_398,uVar15);
        plVar7 = (long *)std::__cxx11::string::replace((ulong)&local_3a0,0,(char *)0x0,0x2a8219);
        local_380 = &local_370;
        plVar11 = plVar7 + 2;
        if ((long *)*plVar7 == plVar11) {
          local_370 = *plVar11;
          lStack_368 = plVar7[3];
        }
        else {
          local_370 = *plVar11;
          local_380 = (long *)*plVar7;
        }
        local_378 = plVar7[1];
        *plVar7 = (long)plVar11;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_380);
        local_2a0 = &local_290;
        puVar9 = puVar8 + 2;
        if ((ulong *)*puVar8 == puVar9) {
          local_290 = *puVar9;
          lStack_288 = puVar8[3];
        }
        else {
          local_290 = *puVar9;
          local_2a0 = (ulong *)*puVar8;
        }
        local_298 = puVar8[1];
        *puVar8 = puVar9;
        puVar8[1] = 0;
        *(undefined1 *)(puVar8 + 2) = 0;
        std::__cxx11::string::_M_append((char *)&local_1a0,(ulong)local_2a0);
        if (local_2a0 != &local_290) {
          operator_delete(local_2a0);
        }
        if (local_380 != &local_370) {
          operator_delete(local_380);
        }
        if (local_3a0 != &local_390) {
          operator_delete(local_3a0);
        }
      }
      else {
        (this_01->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
        super__Vector_impl_data._M_start[sVar16] = uVar14;
        uVar14 = uVar14 + 1;
      }
    }
    sVar16 = sVar16 + 1;
  } while (sVar16 != 100);
  (this_01->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
  super__Vector_impl_data._M_start[100] = 0;
  uVar15 = uVar14 + 1;
  cVar17 = '\x01';
  if (9 < uVar15) {
    uVar13 = uVar15;
    cVar5 = '\x04';
    do {
      cVar17 = cVar5;
      if (uVar13 < 100) {
        cVar17 = cVar17 + -2;
        goto LAB_001354c6;
      }
      if (uVar13 < 1000) {
        cVar17 = cVar17 + -1;
        goto LAB_001354c6;
      }
      if (uVar13 < 10000) goto LAB_001354c6;
      bVar6 = 99999 < uVar13;
      uVar13 = uVar13 / 10000;
      cVar5 = cVar17 + '\x04';
    } while (bVar6);
    cVar17 = cVar17 + '\x01';
  }
LAB_001354c6:
  local_380 = &local_370;
  std::__cxx11::string::_M_construct((ulong)&local_380,cVar17);
  std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_380,(uint)local_378,uVar15);
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_380);
  puVar9 = (ulong *)(plVar7 + 2);
  if ((ulong *)*plVar7 == puVar9) {
    local_290 = *puVar9;
    lStack_288 = plVar7[3];
    local_2a0 = &local_290;
  }
  else {
    local_290 = *puVar9;
    local_2a0 = (ulong *)*plVar7;
  }
  local_298 = plVar7[1];
  *plVar7 = (long)puVar9;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  std::__cxx11::string::_M_append((char *)&local_1a0,(ulong)local_2a0);
  if (local_2a0 != &local_290) {
    operator_delete(local_2a0);
  }
  if (local_380 != &local_370) {
    operator_delete(local_380);
  }
  local_220 = &local_210;
  std::__cxx11::string::_M_construct((ulong)&local_220,'\x06');
  puVar8 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_220,(ulong)local_1a0);
  puVar9 = puVar8 + 2;
  if ((ulong *)*puVar8 == puVar9) {
    local_250 = *puVar9;
    uStack_248 = puVar8[3];
    local_260 = &local_250;
  }
  else {
    local_250 = *puVar9;
    local_260 = (ulong *)*puVar8;
  }
  local_258 = puVar8[1];
  *puVar8 = puVar9;
  puVar8[1] = 0;
  *(undefined1 *)(puVar8 + 2) = 0;
  local_1c0 = &local_1b0;
  std::__cxx11::string::_M_construct((ulong)&local_1c0,'\x06');
  uVar13 = 0xf;
  if (local_260 != &local_250) {
    uVar13 = local_250;
  }
  if (uVar13 < (ulong)(local_1b8 + local_258)) {
    uVar13 = 0xf;
    if (local_1c0 != &local_1b0) {
      uVar13 = local_1b0;
    }
    if (uVar13 < (ulong)(local_1b8 + local_258)) goto LAB_001356a2;
    puVar8 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_1c0,0,(char *)0x0,(ulong)local_260);
  }
  else {
LAB_001356a2:
    puVar8 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_260,(ulong)local_1c0);
  }
  local_280 = &local_270;
  puVar9 = puVar8 + 2;
  if ((ulong *)*puVar8 == puVar9) {
    local_270 = *puVar9;
    lStack_268 = puVar8[3];
  }
  else {
    local_270 = *puVar9;
    local_280 = (ulong *)*puVar8;
  }
  local_278 = puVar8[1];
  *puVar8 = puVar9;
  puVar8[1] = 0;
  *(undefined1 *)puVar9 = 0;
  puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_280);
  local_2e0._M_dataplus._M_p = (pointer)&local_2e0.field_2;
  puVar9 = puVar8 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar8 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar9) {
    local_2e0.field_2._M_allocated_capacity = *puVar9;
    local_2e0.field_2._8_8_ = puVar8[3];
  }
  else {
    local_2e0.field_2._M_allocated_capacity = *puVar9;
    local_2e0._M_dataplus._M_p = (pointer)*puVar8;
  }
  local_2e0._M_string_length = puVar8[1];
  *puVar8 = puVar9;
  puVar8[1] = 0;
  *(undefined1 *)(puVar8 + 2) = 0;
  local_200 = &local_1f0;
  std::__cxx11::string::_M_construct((ulong)&local_200,'\x06');
  uVar18 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
    uVar18 = local_2e0.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar18 < local_1f8 + local_2e0._M_string_length) {
    uVar13 = 0xf;
    if (local_200 != &local_1f0) {
      uVar13 = local_1f0;
    }
    if (uVar13 < local_1f8 + local_2e0._M_string_length) goto LAB_00135804;
    puVar8 = (undefined8 *)
             std::__cxx11::string::replace
                       ((ulong)&local_200,0,(char *)0x0,(ulong)local_2e0._M_dataplus._M_p);
  }
  else {
LAB_00135804:
    puVar8 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_2e0,(ulong)local_200);
  }
  local_2c0._M_dataplus._M_p = (pointer)&local_2c0.field_2;
  puVar9 = puVar8 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar8 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar9) {
    local_2c0.field_2._M_allocated_capacity = *puVar9;
    local_2c0.field_2._8_8_ = puVar8[3];
  }
  else {
    local_2c0.field_2._M_allocated_capacity = *puVar9;
    local_2c0._M_dataplus._M_p = (pointer)*puVar8;
  }
  local_2c0._M_string_length = puVar8[1];
  *puVar8 = puVar9;
  puVar8[1] = 0;
  *(undefined1 *)puVar9 = 0;
  puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_2c0);
  local_320 = &local_310;
  puVar9 = puVar8 + 2;
  if ((ulong *)*puVar8 == puVar9) {
    local_310 = *puVar9;
    uStack_308 = puVar8[3];
  }
  else {
    local_310 = *puVar9;
    local_320 = (ulong *)*puVar8;
  }
  local_318 = puVar8[1];
  *puVar8 = puVar9;
  puVar8[1] = 0;
  *(undefined1 *)(puVar8 + 2) = 0;
  local_240 = &local_230;
  std::__cxx11::string::_M_construct((ulong)&local_240,'\x06');
  uVar13 = 0xf;
  if (local_320 != &local_310) {
    uVar13 = local_310;
  }
  if (uVar13 < (ulong)(local_238 + local_318)) {
    uVar13 = 0xf;
    if (local_240 != &local_230) {
      uVar13 = local_230;
    }
    if (uVar13 < (ulong)(local_238 + local_318)) goto LAB_00135966;
    puVar8 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_240,0,(char *)0x0,(ulong)local_320);
  }
  else {
LAB_00135966:
    puVar8 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_320,(ulong)local_240);
  }
  local_360._M_dataplus._M_p = (pointer)&local_360.field_2;
  puVar9 = puVar8 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar8 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar9) {
    local_360.field_2._M_allocated_capacity = *puVar9;
    local_360.field_2._8_8_ = puVar8[3];
  }
  else {
    local_360.field_2._M_allocated_capacity = *puVar9;
    local_360._M_dataplus._M_p = (pointer)*puVar8;
  }
  local_360._M_string_length = puVar8[1];
  *puVar8 = puVar9;
  puVar8[1] = 0;
  *(undefined1 *)puVar9 = 0;
  puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_360);
  local_340 = &local_330;
  puVar9 = puVar8 + 2;
  if ((ulong *)*puVar8 == puVar9) {
    local_330 = *puVar9;
    uStack_328 = puVar8[3];
  }
  else {
    local_330 = *puVar9;
    local_340 = (ulong *)*puVar8;
  }
  local_338 = puVar8[1];
  *puVar8 = puVar9;
  puVar8[1] = 0;
  *(undefined1 *)(puVar8 + 2) = 0;
  local_1e0 = &local_1d0;
  std::__cxx11::string::_M_construct((ulong)&local_1e0,'\x06');
  uVar13 = 0xf;
  if (local_340 != &local_330) {
    uVar13 = local_330;
  }
  if (uVar13 < (ulong)(local_1d8 + local_338)) {
    uVar13 = 0xf;
    if (local_1e0 != &local_1d0) {
      uVar13 = local_1d0;
    }
    if (uVar13 < (ulong)(local_1d8 + local_338)) goto LAB_00135aa1;
    puVar8 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_1e0,0,(char *)0x0,(ulong)local_340);
  }
  else {
LAB_00135aa1:
    puVar8 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_340,(ulong)local_1e0);
  }
  local_300 = &local_2f0;
  puVar9 = puVar8 + 2;
  if ((ulong *)*puVar8 == puVar9) {
    local_2f0 = *puVar9;
    uStack_2e8 = puVar8[3];
  }
  else {
    local_2f0 = *puVar9;
    local_300 = (ulong *)*puVar8;
  }
  local_2f8 = puVar8[1];
  *puVar8 = puVar9;
  puVar8[1] = 0;
  *(undefined1 *)puVar9 = 0;
  puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_300);
  puVar9 = puVar8 + 2;
  if ((ulong *)*puVar8 == puVar9) {
    local_390 = *puVar9;
    lStack_388 = puVar8[3];
    local_3a0 = &local_390;
  }
  else {
    local_390 = *puVar9;
    local_3a0 = (ulong *)*puVar8;
  }
  local_398 = puVar8[1];
  *puVar8 = puVar9;
  puVar8[1] = 0;
  *(undefined1 *)(puVar8 + 2) = 0;
  local_180._M_dataplus._M_p = (pointer)&local_180.field_2;
  std::__cxx11::string::_M_construct((ulong)&local_180,'\x06');
  uVar13 = 0xf;
  if (local_3a0 != &local_390) {
    uVar13 = local_390;
  }
  if (uVar13 < local_180._M_string_length + local_398) {
    uVar18 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_180._M_dataplus._M_p != &local_180.field_2) {
      uVar18 = local_180.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar18 < local_180._M_string_length + local_398) goto LAB_00135be0;
    puVar8 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_180,0,(char *)0x0,(ulong)local_3a0);
  }
  else {
LAB_00135be0:
    puVar8 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_3a0,(ulong)local_180._M_dataplus._M_p);
  }
  local_380 = &local_370;
  plVar7 = puVar8 + 2;
  if ((long *)*puVar8 == plVar7) {
    local_370 = *plVar7;
    lStack_368 = puVar8[3];
  }
  else {
    local_370 = *plVar7;
    local_380 = (long *)*puVar8;
  }
  local_378 = puVar8[1];
  *puVar8 = plVar7;
  puVar8[1] = 0;
  *(undefined1 *)plVar7 = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_380);
  puVar9 = (ulong *)(plVar7 + 2);
  if ((ulong *)*plVar7 == puVar9) {
    local_290 = *puVar9;
    lStack_288 = plVar7[3];
    local_2a0 = &local_290;
  }
  else {
    local_290 = *puVar9;
    local_2a0 = (ulong *)*plVar7;
  }
  local_298 = plVar7[1];
  *plVar7 = (long)puVar9;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  if (local_380 != &local_370) {
    operator_delete(local_380);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180._M_dataplus._M_p != &local_180.field_2) {
    operator_delete(local_180._M_dataplus._M_p);
  }
  if (local_3a0 != &local_390) {
    operator_delete(local_3a0);
  }
  if (local_300 != &local_2f0) {
    operator_delete(local_300);
  }
  if (local_1e0 != &local_1d0) {
    operator_delete(local_1e0);
  }
  if (local_340 != &local_330) {
    operator_delete(local_340);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_360._M_dataplus._M_p != &local_360.field_2) {
    operator_delete(local_360._M_dataplus._M_p);
  }
  if (local_240 != &local_230) {
    operator_delete(local_240);
  }
  if (local_320 != &local_310) {
    operator_delete(local_320);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
    operator_delete(local_2c0._M_dataplus._M_p);
  }
  if (local_200 != &local_1f0) {
    operator_delete(local_200);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
    operator_delete(local_2e0._M_dataplus._M_p);
  }
  if (local_280 != &local_270) {
    operator_delete(local_280);
  }
  if (local_1c0 != &local_1b0) {
    operator_delete(local_1c0);
  }
  if (local_260 != &local_250) {
    operator_delete(local_260);
  }
  if (local_220 != &local_210) {
    operator_delete(local_220);
  }
  if ((this->_categoricalFeatures).super__Base_bitset<2UL>._M_w[0] == 0) {
    bVar6 = true;
    do {
      bVar4 = bVar6;
      if (!bVar4) break;
      bVar6 = false;
    } while ((this->_categoricalFeatures).super__Base_bitset<2UL>._M_w[1] == 0);
    if (bVar4) goto LAB_00135e46;
  }
  else {
LAB_00135e46:
    local_340 = &local_330;
    std::__cxx11::string::_M_construct((ulong)&local_340,'\x06');
    puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_340);
    puVar9 = puVar8 + 2;
    if ((ulong *)*puVar8 == puVar9) {
      local_2f0 = *puVar9;
      uStack_2e8 = puVar8[3];
      local_300 = &local_2f0;
    }
    else {
      local_2f0 = *puVar9;
      local_300 = (ulong *)*puVar8;
    }
    local_2f8 = puVar8[1];
    *puVar8 = puVar9;
    puVar8[1] = 0;
    *(undefined1 *)(puVar8 + 2) = 0;
    cVar17 = '\x01';
    if (9 < uVar15) {
      uVar13 = uVar15;
      cVar5 = '\x04';
      do {
        cVar17 = cVar5;
        if (uVar13 < 100) {
          cVar17 = cVar17 + -2;
          goto LAB_00135f1c;
        }
        if (uVar13 < 1000) {
          cVar17 = cVar17 + -1;
          goto LAB_00135f1c;
        }
        if (uVar13 < 10000) goto LAB_00135f1c;
        bVar6 = 99999 < uVar13;
        uVar13 = uVar13 / 10000;
        cVar5 = cVar17 + '\x04';
      } while (bVar6);
      cVar17 = cVar17 + '\x01';
    }
LAB_00135f1c:
    local_360._M_dataplus._M_p = (pointer)&local_360.field_2;
    std::__cxx11::string::_M_construct((ulong)&local_360,cVar17);
    std::__detail::__to_chars_10_impl<unsigned_long>
              (local_360._M_dataplus._M_p,(uint)local_360._M_string_length,uVar15);
    uVar15 = 0xf;
    if (local_300 != &local_2f0) {
      uVar15 = local_2f0;
    }
    if (uVar15 < local_360._M_string_length + local_2f8) {
      uVar18 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_360._M_dataplus._M_p != &local_360.field_2) {
        uVar18 = local_360.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar18 < local_360._M_string_length + local_2f8) goto LAB_00135f93;
      puVar8 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_360,0,(char *)0x0,(ulong)local_300);
    }
    else {
LAB_00135f93:
      puVar8 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_300,(ulong)local_360._M_dataplus._M_p)
      ;
    }
    puVar9 = puVar8 + 2;
    if ((ulong *)*puVar8 == puVar9) {
      local_390 = *puVar9;
      lStack_388 = puVar8[3];
      local_3a0 = &local_390;
    }
    else {
      local_390 = *puVar9;
      local_3a0 = (ulong *)*puVar8;
    }
    local_398 = puVar8[1];
    *puVar8 = puVar9;
    puVar8[1] = 0;
    *(undefined1 *)puVar9 = 0;
    puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_3a0);
    plVar7 = puVar8 + 2;
    if ((long *)*puVar8 == plVar7) {
      local_370 = *plVar7;
      lStack_368 = puVar8[3];
      local_380 = &local_370;
    }
    else {
      local_370 = *plVar7;
      local_380 = (long *)*puVar8;
    }
    local_378 = puVar8[1];
    *puVar8 = plVar7;
    puVar8[1] = 0;
    *(undefined1 *)(puVar8 + 2) = 0;
    std::__cxx11::string::_M_append((char *)&local_2a0,(ulong)local_380);
    if (local_380 != &local_370) {
      operator_delete(local_380);
    }
    if (local_3a0 != &local_390) {
      operator_delete(local_3a0);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_360._M_dataplus._M_p != &local_360.field_2) {
      operator_delete(local_360._M_dataplus._M_p);
    }
    if (local_300 != &local_2f0) {
      operator_delete(local_300);
    }
    if (local_340 != &local_330) {
      operator_delete(local_340);
    }
  }
  sVar16 = 0;
  do {
    bVar6 = std::bitset<100UL>::test(this_00,sVar16);
    if (bVar6) {
      bVar6 = std::bitset<100UL>::test(local_f8,sVar16);
      if (bVar6) {
        puVar9 = *(ulong **)
                  &((*(this->parameterQueries[sVar16]->_aggregates).
                      super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>._M_impl.
                      super__Vector_impl_data._M_start)->_incoming).
                   super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                   ._M_impl.super__Vector_impl_data;
        local_340 = &local_330;
        std::__cxx11::string::_M_construct((ulong)&local_340,'\x03');
        puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_340);
        puVar12 = puVar8 + 2;
        if ((ulong *)*puVar8 == puVar12) {
          local_2f0 = *puVar12;
          uStack_2e8 = puVar8[3];
          local_300 = &local_2f0;
        }
        else {
          local_2f0 = *puVar12;
          local_300 = (ulong *)*puVar8;
        }
        local_2f8 = puVar8[1];
        *puVar8 = puVar12;
        puVar8[1] = 0;
        *(undefined1 *)(puVar8 + 2) = 0;
        getAttributeName_abi_cxx11_(&local_360,this,sVar16);
        uVar15 = 0xf;
        if (local_300 != &local_2f0) {
          uVar15 = local_2f0;
        }
        if (uVar15 < local_360._M_string_length + local_2f8) {
          uVar18 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_360._M_dataplus._M_p != &local_360.field_2) {
            uVar18 = local_360.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar18 < local_360._M_string_length + local_2f8) goto LAB_001361dd;
          puVar8 = (undefined8 *)
                   std::__cxx11::string::replace((ulong)&local_360,0,(char *)0x0,(ulong)local_300);
        }
        else {
LAB_001361dd:
          puVar8 = (undefined8 *)
                   std::__cxx11::string::_M_append
                             ((char *)&local_300,(ulong)local_360._M_dataplus._M_p);
        }
        puVar12 = puVar8 + 2;
        if ((ulong *)*puVar8 == puVar12) {
          local_390 = *puVar12;
          lStack_388 = puVar8[3];
          local_3a0 = &local_390;
        }
        else {
          local_390 = *puVar12;
          local_3a0 = (ulong *)*puVar8;
        }
        local_398 = puVar8[1];
        *puVar8 = puVar12;
        puVar8[1] = 0;
        *(undefined1 *)puVar12 = 0;
        plVar7 = (long *)std::__cxx11::string::append((char *)&local_3a0);
        local_380 = &local_370;
        plVar11 = plVar7 + 2;
        if ((long *)*plVar7 == plVar11) {
          local_370 = *plVar11;
          lStack_368 = plVar7[3];
        }
        else {
          local_370 = *plVar11;
          local_380 = (long *)*plVar7;
        }
        local_378 = plVar7[1];
        *plVar7 = (long)plVar11;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        std::__cxx11::string::_M_append((char *)&local_160,(ulong)local_380);
        if (local_380 != &local_370) {
          operator_delete(local_380);
        }
        if (local_3a0 != &local_390) {
          operator_delete(local_3a0);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_360._M_dataplus._M_p != &local_360.field_2) {
          operator_delete(local_360._M_dataplus._M_p);
        }
        if (local_300 != &local_2f0) {
          operator_delete(local_300);
        }
        if (local_340 != &local_330) {
          operator_delete(local_340);
        }
        local_320 = &local_310;
        std::__cxx11::string::_M_construct((ulong)&local_320,'\x06');
        plVar7 = (long *)std::__cxx11::string::append((char *)&local_320);
        local_360._M_dataplus._M_p = (pointer)&local_360.field_2;
        puVar12 = (ulong *)(plVar7 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar7 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar12) {
          local_360.field_2._M_allocated_capacity = *puVar12;
          local_360.field_2._8_8_ = plVar7[3];
        }
        else {
          local_360.field_2._M_allocated_capacity = *puVar12;
          local_360._M_dataplus._M_p = (pointer)*plVar7;
        }
        local_360._M_string_length = plVar7[1];
        *plVar7 = (long)puVar12;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        getAttributeName_abi_cxx11_(&local_2c0,this,sVar16);
        uVar18 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_360._M_dataplus._M_p != &local_360.field_2) {
          uVar18 = local_360.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar18 < local_2c0._M_string_length + local_360._M_string_length) {
          uVar18 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
            uVar18 = local_2c0.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar18 < local_2c0._M_string_length + local_360._M_string_length)
          goto LAB_001363f9;
          puVar8 = (undefined8 *)
                   std::__cxx11::string::replace
                             ((ulong)&local_2c0,0,(char *)0x0,(ulong)local_360._M_dataplus._M_p);
        }
        else {
LAB_001363f9:
          puVar8 = (undefined8 *)
                   std::__cxx11::string::_M_append
                             ((char *)&local_360,(ulong)local_2c0._M_dataplus._M_p);
        }
        puVar12 = puVar8 + 2;
        if ((ulong *)*puVar8 == puVar12) {
          local_330 = *puVar12;
          uStack_328 = puVar8[3];
          local_340 = &local_330;
        }
        else {
          local_330 = *puVar12;
          local_340 = (ulong *)*puVar8;
        }
        local_338 = puVar8[1];
        *puVar8 = puVar12;
        puVar8[1] = 0;
        *(undefined1 *)puVar12 = 0;
        puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_340);
        puVar12 = puVar8 + 2;
        if ((ulong *)*puVar8 == puVar12) {
          local_2f0 = *puVar12;
          uStack_2e8 = puVar8[3];
          local_300 = &local_2f0;
        }
        else {
          local_2f0 = *puVar12;
          local_300 = (ulong *)*puVar8;
        }
        local_2f8 = puVar8[1];
        *puVar8 = puVar12;
        puVar8[1] = 0;
        *(undefined1 *)(puVar8 + 2) = 0;
        uVar15 = *puVar9;
        cVar17 = '\x01';
        if (9 < uVar15) {
          uVar13 = uVar15;
          cVar5 = '\x04';
          do {
            cVar17 = cVar5;
            if (uVar13 < 100) {
              cVar17 = cVar17 + -2;
              goto LAB_0013651d;
            }
            if (uVar13 < 1000) {
              cVar17 = cVar17 + -1;
              goto LAB_0013651d;
            }
            if (uVar13 < 10000) goto LAB_0013651d;
            bVar6 = 99999 < uVar13;
            uVar13 = uVar13 / 10000;
            cVar5 = cVar17 + '\x04';
          } while (bVar6);
          cVar17 = cVar17 + '\x01';
        }
LAB_0013651d:
        local_2e0._M_dataplus._M_p = (pointer)&local_2e0.field_2;
        std::__cxx11::string::_M_construct((ulong)&local_2e0,cVar17);
        std::__detail::__to_chars_10_impl<unsigned_long>
                  (local_2e0._M_dataplus._M_p,(uint)local_2e0._M_string_length,uVar15);
        uVar15 = 0xf;
        if (local_300 != &local_2f0) {
          uVar15 = local_2f0;
        }
        if (uVar15 < local_2e0._M_string_length + local_2f8) {
          uVar18 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
            uVar18 = local_2e0.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar18 < local_2e0._M_string_length + local_2f8) goto LAB_001365b1;
          puVar8 = (undefined8 *)
                   std::__cxx11::string::replace((ulong)&local_2e0,0,(char *)0x0,(ulong)local_300);
        }
        else {
LAB_001365b1:
          puVar8 = (undefined8 *)
                   std::__cxx11::string::_M_append
                             ((char *)&local_300,(ulong)local_2e0._M_dataplus._M_p);
        }
        puVar12 = puVar8 + 2;
        if ((ulong *)*puVar8 == puVar12) {
          local_390 = *puVar12;
          lStack_388 = puVar8[3];
          local_3a0 = &local_390;
        }
        else {
          local_390 = *puVar12;
          local_3a0 = (ulong *)*puVar8;
        }
        local_398 = puVar8[1];
        *puVar8 = puVar12;
        puVar8[1] = 0;
        *(undefined1 *)puVar12 = 0;
        plVar7 = (long *)std::__cxx11::string::append((char *)&local_3a0);
        local_380 = &local_370;
        plVar11 = plVar7 + 2;
        if ((long *)*plVar7 == plVar11) {
          local_370 = *plVar11;
          lStack_368 = plVar7[3];
        }
        else {
          local_370 = *plVar11;
          local_380 = (long *)*plVar7;
        }
        local_378 = plVar7[1];
        *plVar7 = (long)plVar11;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        std::__cxx11::string::_M_append((char *)&local_2a0,(ulong)local_380);
        if (local_380 != &local_370) {
          operator_delete(local_380);
        }
        if (local_3a0 != &local_390) {
          operator_delete(local_3a0);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
          operator_delete(local_2e0._M_dataplus._M_p);
        }
        if (local_300 != &local_2f0) {
          operator_delete(local_300);
        }
        if (local_340 != &local_330) {
          operator_delete(local_340);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
          operator_delete(local_2c0._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_360._M_dataplus._M_p != &local_360.field_2) {
          operator_delete(local_360._M_dataplus._M_p);
        }
        if (local_320 != &local_310) {
          operator_delete(local_320);
        }
        local_1c0 = &local_1b0;
        std::__cxx11::string::_M_construct((ulong)&local_1c0,'\x06');
        plVar7 = (long *)std::__cxx11::string::append((char *)&local_1c0);
        local_220 = &local_210;
        puVar12 = (ulong *)(plVar7 + 2);
        if ((ulong *)*plVar7 == puVar12) {
          local_210 = *puVar12;
          lStack_208 = plVar7[3];
        }
        else {
          local_210 = *puVar12;
          local_220 = (ulong *)*plVar7;
        }
        local_218 = plVar7[1];
        *plVar7 = (long)puVar12;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        uVar15 = *puVar9;
        cVar17 = '\x01';
        if (9 < uVar15) {
          uVar13 = uVar15;
          cVar5 = '\x04';
          do {
            cVar17 = cVar5;
            if (uVar13 < 100) {
              cVar17 = cVar17 + -2;
              goto LAB_00136821;
            }
            if (uVar13 < 1000) {
              cVar17 = cVar17 + -1;
              goto LAB_00136821;
            }
            if (uVar13 < 10000) goto LAB_00136821;
            bVar6 = 99999 < uVar13;
            uVar13 = uVar13 / 10000;
            cVar5 = cVar17 + '\x04';
          } while (bVar6);
          cVar17 = cVar17 + '\x01';
        }
LAB_00136821:
        local_200 = &local_1f0;
        std::__cxx11::string::_M_construct((ulong)&local_200,cVar17);
        std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_200,(uint)local_1f8,uVar15);
        uVar15 = 0xf;
        if (local_220 != &local_210) {
          uVar15 = local_210;
        }
        if (uVar15 < (ulong)(local_1f8 + local_218)) {
          uVar15 = 0xf;
          if (local_200 != &local_1f0) {
            uVar15 = local_1f0;
          }
          if (uVar15 < (ulong)(local_1f8 + local_218)) goto LAB_001368c0;
          puVar8 = (undefined8 *)
                   std::__cxx11::string::replace((ulong)&local_200,0,(char *)0x0,(ulong)local_220);
        }
        else {
LAB_001368c0:
          puVar8 = (undefined8 *)
                   std::__cxx11::string::_M_append((char *)&local_220,(ulong)local_200);
        }
        local_260 = &local_250;
        puVar12 = puVar8 + 2;
        if ((ulong *)*puVar8 == puVar12) {
          local_250 = *puVar12;
          uStack_248 = puVar8[3];
        }
        else {
          local_250 = *puVar12;
          local_260 = (ulong *)*puVar8;
        }
        local_258 = puVar8[1];
        *puVar8 = puVar12;
        puVar8[1] = 0;
        *(undefined1 *)puVar12 = 0;
        puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_260);
        puVar12 = puVar8 + 2;
        if ((ulong *)*puVar8 == puVar12) {
          local_270 = *puVar12;
          lStack_268 = puVar8[3];
          local_280 = &local_270;
        }
        else {
          local_270 = *puVar12;
          local_280 = (ulong *)*puVar8;
        }
        local_278 = puVar8[1];
        *puVar8 = puVar12;
        puVar8[1] = 0;
        *(undefined1 *)(puVar8 + 2) = 0;
        uVar15 = *puVar9;
        cVar17 = '\x01';
        if (9 < uVar15) {
          uVar13 = uVar15;
          cVar5 = '\x04';
          do {
            cVar17 = cVar5;
            if (uVar13 < 100) {
              cVar17 = cVar17 + -2;
              goto LAB_00136a13;
            }
            if (uVar13 < 1000) {
              cVar17 = cVar17 + -1;
              goto LAB_00136a13;
            }
            if (uVar13 < 10000) goto LAB_00136a13;
            bVar6 = 99999 < uVar13;
            uVar13 = uVar13 / 10000;
            cVar5 = cVar17 + '\x04';
          } while (bVar6);
          cVar17 = cVar17 + '\x01';
        }
LAB_00136a13:
        local_240 = &local_230;
        std::__cxx11::string::_M_construct((ulong)&local_240,cVar17);
        std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_240,(uint)local_238,uVar15);
        uVar15 = 0xf;
        if (local_280 != &local_270) {
          uVar15 = local_270;
        }
        if (uVar15 < (ulong)(local_238 + local_278)) {
          uVar15 = 0xf;
          if (local_240 != &local_230) {
            uVar15 = local_230;
          }
          if (uVar15 < (ulong)(local_238 + local_278)) goto LAB_00136aa7;
          puVar8 = (undefined8 *)
                   std::__cxx11::string::replace((ulong)&local_240,0,(char *)0x0,(ulong)local_280);
        }
        else {
LAB_00136aa7:
          puVar8 = (undefined8 *)
                   std::__cxx11::string::_M_append((char *)&local_280,(ulong)local_240);
        }
        local_2e0._M_dataplus._M_p = (pointer)&local_2e0.field_2;
        puVar9 = puVar8 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar8 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar9) {
          local_2e0.field_2._M_allocated_capacity = *puVar9;
          local_2e0.field_2._8_8_ = puVar8[3];
        }
        else {
          local_2e0.field_2._M_allocated_capacity = *puVar9;
          local_2e0._M_dataplus._M_p = (pointer)*puVar8;
        }
        local_2e0._M_string_length = puVar8[1];
        *puVar8 = puVar9;
        puVar8[1] = 0;
        *(undefined1 *)puVar9 = 0;
        puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_2e0);
        local_2c0._M_dataplus._M_p = (pointer)&local_2c0.field_2;
        puVar9 = puVar8 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar8 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar9) {
          local_2c0.field_2._M_allocated_capacity = *puVar9;
          local_2c0.field_2._8_8_ = puVar8[3];
        }
        else {
          local_2c0.field_2._M_allocated_capacity = *puVar9;
          local_2c0._M_dataplus._M_p = (pointer)*puVar8;
        }
        local_2c0._M_string_length = puVar8[1];
        *puVar8 = puVar9;
        puVar8[1] = 0;
        *(undefined1 *)(puVar8 + 2) = 0;
        local_1e0 = &local_1d0;
        std::__cxx11::string::_M_construct((ulong)&local_1e0,'\t');
        uVar18 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
          uVar18 = local_2c0.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar18 < local_1d8 + local_2c0._M_string_length) {
          uVar15 = 0xf;
          if (local_1e0 != &local_1d0) {
            uVar15 = local_1d0;
          }
          if (uVar15 < local_1d8 + local_2c0._M_string_length) goto LAB_00136c15;
          puVar8 = (undefined8 *)
                   std::__cxx11::string::replace
                             ((ulong)&local_1e0,0,(char *)0x0,(ulong)local_2c0._M_dataplus._M_p);
        }
        else {
LAB_00136c15:
          puVar8 = (undefined8 *)
                   std::__cxx11::string::_M_append((char *)&local_2c0,(ulong)local_1e0);
        }
        local_320 = &local_310;
        puVar9 = puVar8 + 2;
        if ((ulong *)*puVar8 == puVar9) {
          local_310 = *puVar9;
          uStack_308 = puVar8[3];
        }
        else {
          local_310 = *puVar9;
          local_320 = (ulong *)*puVar8;
        }
        local_318 = puVar8[1];
        *puVar8 = puVar9;
        puVar8[1] = 0;
        *(undefined1 *)puVar9 = 0;
        puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_320);
        local_360._M_dataplus._M_p = (pointer)&local_360.field_2;
        puVar9 = puVar8 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar8 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar9) {
          local_360.field_2._M_allocated_capacity = *puVar9;
          local_360.field_2._8_8_ = puVar8[3];
        }
        else {
          local_360.field_2._M_allocated_capacity = *puVar9;
          local_360._M_dataplus._M_p = (pointer)*puVar8;
        }
        local_360._M_string_length = puVar8[1];
        *puVar8 = puVar9;
        puVar8[1] = 0;
        *(undefined1 *)(puVar8 + 2) = 0;
        getAttributeName_abi_cxx11_(&local_180,this,sVar16);
        uVar18 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_360._M_dataplus._M_p != &local_360.field_2) {
          uVar18 = local_360.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar18 < local_180._M_string_length + local_360._M_string_length) {
          uVar18 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_180._M_dataplus._M_p != &local_180.field_2) {
            uVar18 = local_180.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar18 < local_180._M_string_length + local_360._M_string_length)
          goto LAB_00136d55;
          puVar8 = (undefined8 *)
                   std::__cxx11::string::replace
                             ((ulong)&local_180,0,(char *)0x0,(ulong)local_360._M_dataplus._M_p);
        }
        else {
LAB_00136d55:
          puVar8 = (undefined8 *)
                   std::__cxx11::string::_M_append
                             ((char *)&local_360,(ulong)local_180._M_dataplus._M_p);
        }
        local_340 = &local_330;
        puVar9 = puVar8 + 2;
        if ((ulong *)*puVar8 == puVar9) {
          local_330 = *puVar9;
          uStack_328 = puVar8[3];
        }
        else {
          local_330 = *puVar9;
          local_340 = (ulong *)*puVar8;
        }
        local_338 = puVar8[1];
        *puVar8 = puVar9;
        puVar8[1] = 0;
        *(undefined1 *)puVar9 = 0;
        puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_340);
        puVar9 = puVar8 + 2;
        if ((ulong *)*puVar8 == puVar9) {
          local_2f0 = *puVar9;
          uStack_2e8 = puVar8[3];
          local_300 = &local_2f0;
        }
        else {
          local_2f0 = *puVar9;
          local_300 = (ulong *)*puVar8;
        }
        local_2f8 = puVar8[1];
        *puVar8 = puVar9;
        puVar8[1] = 0;
        *(undefined1 *)(puVar8 + 2) = 0;
        getAttributeName_abi_cxx11_(&local_140,this,sVar16);
        uVar15 = 0xf;
        if (local_300 != &local_2f0) {
          uVar15 = local_2f0;
        }
        if (uVar15 < local_140._M_string_length + local_2f8) {
          uVar18 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_140._M_dataplus._M_p != &local_140.field_2) {
            uVar18 = local_140.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar18 < local_140._M_string_length + local_2f8) goto LAB_00136e8b;
          puVar8 = (undefined8 *)
                   std::__cxx11::string::replace((ulong)&local_140,0,(char *)0x0,(ulong)local_300);
        }
        else {
LAB_00136e8b:
          puVar8 = (undefined8 *)
                   std::__cxx11::string::_M_append
                             ((char *)&local_300,(ulong)local_140._M_dataplus._M_p);
        }
        puVar9 = puVar8 + 2;
        if ((ulong *)*puVar8 == puVar9) {
          local_390 = *puVar9;
          lStack_388 = puVar8[3];
          local_3a0 = &local_390;
        }
        else {
          local_390 = *puVar9;
          local_3a0 = (ulong *)*puVar8;
        }
        local_398 = puVar8[1];
        *puVar8 = puVar9;
        puVar8[1] = 0;
        *(undefined1 *)puVar9 = 0;
        puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_3a0);
        plVar7 = puVar8 + 2;
        if ((long *)*puVar8 == plVar7) {
          local_370 = *plVar7;
          lStack_368 = puVar8[3];
          local_380 = &local_370;
        }
        else {
          local_370 = *plVar7;
          local_380 = (long *)*puVar8;
        }
        local_378 = puVar8[1];
        *puVar8 = plVar7;
        puVar8[1] = 0;
        *(undefined1 *)(puVar8 + 2) = 0;
        std::__cxx11::string::_M_append((char *)&local_2a0,(ulong)local_380);
        if (local_380 != &local_370) {
          operator_delete(local_380);
        }
        if (local_3a0 != &local_390) {
          operator_delete(local_3a0);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_140._M_dataplus._M_p != &local_140.field_2) {
          operator_delete(local_140._M_dataplus._M_p);
        }
        if (local_300 != &local_2f0) {
          operator_delete(local_300);
        }
        if (local_340 != &local_330) {
          operator_delete(local_340);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_180._M_dataplus._M_p != &local_180.field_2) {
          operator_delete(local_180._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_360._M_dataplus._M_p != &local_360.field_2) {
          operator_delete(local_360._M_dataplus._M_p);
        }
        if (local_320 != &local_310) {
          operator_delete(local_320);
        }
        if (local_1e0 != &local_1d0) {
          operator_delete(local_1e0);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
          operator_delete(local_2c0._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
          operator_delete(local_2e0._M_dataplus._M_p);
        }
        if (local_240 != &local_230) {
          operator_delete(local_240);
        }
        if (local_280 != &local_270) {
          operator_delete(local_280);
        }
        if (local_260 != &local_250) {
          operator_delete(local_260);
        }
        if (local_200 != &local_1f0) {
          operator_delete(local_200);
        }
        if (local_220 != &local_210) {
          operator_delete(local_220);
        }
        if (local_1c0 != &local_1b0) {
          operator_delete(local_1c0);
        }
      }
    }
    sVar16 = sVar16 + 1;
  } while (sVar16 != 100);
  local_180._M_dataplus._M_p = (pointer)&local_180.field_2;
  std::__cxx11::string::_M_construct((ulong)&local_180,'\x06');
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_180);
  local_1e0 = &local_1d0;
  puVar9 = (ulong *)(plVar7 + 2);
  if ((ulong *)*plVar7 == puVar9) {
    local_1d0 = *puVar9;
    lStack_1c8 = plVar7[3];
  }
  else {
    local_1d0 = *puVar9;
    local_1e0 = (ulong *)*plVar7;
  }
  local_1d8 = plVar7[1];
  *plVar7 = (long)puVar9;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
  std::__cxx11::string::_M_construct((ulong)&local_140,'\x06');
  uVar15 = 0xf;
  if (local_1e0 != &local_1d0) {
    uVar15 = local_1d0;
  }
  if (uVar15 < local_140._M_string_length + local_1d8) {
    uVar18 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_140._M_dataplus._M_p != &local_140.field_2) {
      uVar18 = local_140.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar18 < local_140._M_string_length + local_1d8) goto LAB_00137219;
    puVar8 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_140,0,(char *)0x0,(ulong)local_1e0);
  }
  else {
LAB_00137219:
    puVar8 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_1e0,(ulong)local_140._M_dataplus._M_p);
  }
  local_240 = &local_230;
  puVar9 = puVar8 + 2;
  if ((ulong *)*puVar8 == puVar9) {
    local_230 = *puVar9;
    uStack_228 = puVar8[3];
  }
  else {
    local_230 = *puVar9;
    local_240 = (ulong *)*puVar8;
  }
  local_238 = puVar8[1];
  *puVar8 = puVar9;
  puVar8[1] = 0;
  *(undefined1 *)puVar9 = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_240);
  local_200 = &local_1f0;
  puVar9 = (ulong *)(plVar7 + 2);
  if ((ulong *)*plVar7 == puVar9) {
    local_1f0 = *puVar9;
    lStack_1e8 = plVar7[3];
  }
  else {
    local_1f0 = *puVar9;
    local_200 = (ulong *)*plVar7;
  }
  local_1f8 = plVar7[1];
  *plVar7 = (long)puVar9;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  local_d0 = local_c0;
  std::__cxx11::string::_M_construct((ulong)&local_d0,'\t');
  uVar15 = 0xf;
  if (local_200 != &local_1f0) {
    uVar15 = local_1f0;
  }
  if (uVar15 < (ulong)(local_c8 + local_1f8)) {
    uVar15 = 0xf;
    if (local_d0 != local_c0) {
      uVar15 = local_c0[0];
    }
    if (uVar15 < (ulong)(local_c8 + local_1f8)) goto LAB_0013737b;
    puVar8 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_d0,0,(char *)0x0,(ulong)local_200);
  }
  else {
LAB_0013737b:
    puVar8 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_200,(ulong)local_d0);
  }
  local_1c0 = &local_1b0;
  puVar9 = puVar8 + 2;
  if ((ulong *)*puVar8 == puVar9) {
    local_1b0 = *puVar9;
    uStack_1a8 = puVar8[3];
  }
  else {
    local_1b0 = *puVar9;
    local_1c0 = (ulong *)*puVar8;
  }
  local_1b8 = puVar8[1];
  *puVar8 = puVar9;
  puVar8[1] = 0;
  *(undefined1 *)puVar9 = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_1c0);
  puVar9 = (ulong *)(plVar7 + 2);
  if ((ulong *)*plVar7 == puVar9) {
    local_210 = *puVar9;
    lStack_208 = plVar7[3];
    local_220 = &local_210;
  }
  else {
    local_210 = *puVar9;
    local_220 = (ulong *)*plVar7;
  }
  local_218 = plVar7[1];
  *plVar7 = (long)puVar9;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  local_50 = local_40;
  std::__cxx11::string::_M_construct((ulong)&local_50,'\t');
  uVar15 = 0xf;
  if (local_220 != &local_210) {
    uVar15 = local_210;
  }
  if (uVar15 < (ulong)(local_48 + local_218)) {
    uVar15 = 0xf;
    if (local_50 != local_40) {
      uVar15 = local_40[0];
    }
    if (uVar15 < (ulong)(local_48 + local_218)) goto LAB_001374cd;
    puVar8 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_50,0,(char *)0x0,(ulong)local_220);
  }
  else {
LAB_001374cd:
    puVar8 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_220,(ulong)local_50);
  }
  puVar9 = puVar8 + 2;
  if ((ulong *)*puVar8 == puVar9) {
    local_250 = *puVar9;
    uStack_248 = puVar8[3];
    local_260 = &local_250;
  }
  else {
    local_250 = *puVar9;
    local_260 = (ulong *)*puVar8;
  }
  local_258 = puVar8[1];
  *puVar8 = puVar9;
  puVar8[1] = 0;
  *(undefined1 *)puVar9 = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_260);
  local_280 = &local_270;
  puVar9 = (ulong *)(plVar7 + 2);
  if ((ulong *)*plVar7 == puVar9) {
    local_270 = *puVar9;
    lStack_268 = plVar7[3];
  }
  else {
    local_270 = *puVar9;
    local_280 = (ulong *)*plVar7;
  }
  local_278 = plVar7[1];
  *plVar7 = (long)puVar9;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  local_70 = local_60;
  std::__cxx11::string::_M_construct((ulong)&local_70,'\x06');
  uVar15 = 0xf;
  if (local_280 != &local_270) {
    uVar15 = local_270;
  }
  if (uVar15 < (ulong)(local_68 + local_278)) {
    uVar15 = 0xf;
    if (local_70 != local_60) {
      uVar15 = local_60[0];
    }
    if (uVar15 < (ulong)(local_68 + local_278)) goto LAB_00137638;
    puVar8 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_70,0,(char *)0x0,(ulong)local_280);
  }
  else {
LAB_00137638:
    puVar8 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_280,(ulong)local_70);
  }
  psVar10 = puVar8 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar8 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar10) {
    local_2e0.field_2._M_allocated_capacity = *psVar10;
    local_2e0.field_2._8_8_ = puVar8[3];
    local_2e0._M_dataplus._M_p = (pointer)&local_2e0.field_2;
  }
  else {
    local_2e0.field_2._M_allocated_capacity = *psVar10;
    local_2e0._M_dataplus._M_p = (pointer)*puVar8;
  }
  local_2e0._M_string_length = puVar8[1];
  *puVar8 = psVar10;
  puVar8[1] = 0;
  *(undefined1 *)psVar10 = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_2e0);
  local_2c0._M_dataplus._M_p = (pointer)&local_2c0.field_2;
  puVar9 = (ulong *)(plVar7 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar9) {
    local_2c0.field_2._M_allocated_capacity = *puVar9;
    local_2c0.field_2._8_8_ = plVar7[3];
  }
  else {
    local_2c0.field_2._M_allocated_capacity = *puVar9;
    local_2c0._M_dataplus._M_p = (pointer)*plVar7;
  }
  local_2c0._M_string_length = plVar7[1];
  *plVar7 = (long)puVar9;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  local_90 = local_80;
  std::__cxx11::string::_M_construct((ulong)&local_90,'\x06');
  uVar18 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
    uVar18 = local_2c0.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar18 < local_88 + local_2c0._M_string_length) {
    uVar15 = 0xf;
    if (local_90 != local_80) {
      uVar15 = local_80[0];
    }
    if (uVar15 < local_88 + local_2c0._M_string_length) goto LAB_00137792;
    puVar8 = (undefined8 *)
             std::__cxx11::string::replace
                       ((ulong)&local_90,0,(char *)0x0,(ulong)local_2c0._M_dataplus._M_p);
  }
  else {
LAB_00137792:
    puVar8 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_2c0,(ulong)local_90);
  }
  puVar9 = puVar8 + 2;
  if ((ulong *)*puVar8 == puVar9) {
    local_310 = *puVar9;
    uStack_308 = puVar8[3];
    local_320 = &local_310;
  }
  else {
    local_310 = *puVar9;
    local_320 = (ulong *)*puVar8;
  }
  local_318 = puVar8[1];
  *puVar8 = puVar9;
  puVar8[1] = 0;
  *(undefined1 *)puVar9 = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_320);
  local_360._M_dataplus._M_p = (pointer)&local_360.field_2;
  puVar9 = (ulong *)(plVar7 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar9) {
    local_360.field_2._M_allocated_capacity = *puVar9;
    local_360.field_2._8_8_ = plVar7[3];
  }
  else {
    local_360.field_2._M_allocated_capacity = *puVar9;
    local_360._M_dataplus._M_p = (pointer)*plVar7;
  }
  local_360._M_string_length = plVar7[1];
  *plVar7 = (long)puVar9;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  uVar15 = (this->_parameterIndex).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
           ._M_impl.super__Vector_impl_data._M_start[this->labelID];
  cVar17 = '\x01';
  if (9 < uVar15) {
    uVar13 = uVar15;
    cVar5 = '\x04';
    do {
      cVar17 = cVar5;
      if (uVar13 < 100) {
        cVar17 = cVar17 + -2;
        goto LAB_001378d4;
      }
      if (uVar13 < 1000) {
        cVar17 = cVar17 + -1;
        goto LAB_001378d4;
      }
      if (uVar13 < 10000) goto LAB_001378d4;
      bVar6 = 99999 < uVar13;
      uVar13 = uVar13 / 10000;
      cVar5 = cVar17 + '\x04';
    } while (bVar6);
    cVar17 = cVar17 + '\x01';
  }
LAB_001378d4:
  local_f0 = local_e0;
  std::__cxx11::string::_M_construct((ulong)&local_f0,cVar17);
  std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_f0,local_e8,uVar15);
  uVar15 = CONCAT44(uStack_e4,local_e8) + local_360._M_string_length;
  uVar18 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_360._M_dataplus._M_p != &local_360.field_2) {
    uVar18 = local_360.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar18 < uVar15) {
    uVar13 = 0xf;
    if (local_f0 != local_e0) {
      uVar13 = local_e0[0];
    }
    if (uVar13 < uVar15) goto LAB_00137953;
    puVar8 = (undefined8 *)
             std::__cxx11::string::replace
                       ((ulong)&local_f0,0,(char *)0x0,(ulong)local_360._M_dataplus._M_p);
  }
  else {
LAB_00137953:
    puVar8 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_360,(ulong)local_f0);
  }
  local_340 = &local_330;
  puVar9 = puVar8 + 2;
  if ((ulong *)*puVar8 == puVar9) {
    local_330 = *puVar9;
    uStack_328 = puVar8[3];
  }
  else {
    local_330 = *puVar9;
    local_340 = (ulong *)*puVar8;
  }
  local_338 = puVar8[1];
  *puVar8 = puVar9;
  puVar8[1] = 0;
  *(undefined1 *)puVar9 = 0;
  puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_340);
  puVar9 = puVar8 + 2;
  if ((ulong *)*puVar8 == puVar9) {
    local_2f0 = *puVar9;
    uStack_2e8 = puVar8[3];
    local_300 = &local_2f0;
  }
  else {
    local_2f0 = *puVar9;
    local_300 = (ulong *)*puVar8;
  }
  local_2f8 = puVar8[1];
  *puVar8 = puVar9;
  puVar8[1] = 0;
  *(undefined1 *)(puVar8 + 2) = 0;
  local_b0 = local_a0;
  std::__cxx11::string::_M_construct((ulong)&local_b0,'\x06');
  uVar15 = 0xf;
  if (local_300 != &local_2f0) {
    uVar15 = local_2f0;
  }
  if (uVar15 < (ulong)(local_a8 + local_2f8)) {
    uVar15 = 0xf;
    if (local_b0 != local_a0) {
      uVar15 = local_a0[0];
    }
    if (uVar15 < (ulong)(local_a8 + local_2f8)) goto LAB_00137a92;
    puVar8 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_b0,0,(char *)0x0,(ulong)local_300);
  }
  else {
LAB_00137a92:
    puVar8 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_300,(ulong)local_b0);
  }
  local_3a0 = &local_390;
  puVar9 = puVar8 + 2;
  if ((ulong *)*puVar8 == puVar9) {
    local_390 = *puVar9;
    lStack_388 = puVar8[3];
  }
  else {
    local_390 = *puVar9;
    local_3a0 = (ulong *)*puVar8;
  }
  local_398 = puVar8[1];
  *puVar8 = puVar9;
  puVar8[1] = 0;
  *(undefined1 *)puVar9 = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_3a0);
  local_380 = &local_370;
  plVar11 = plVar7 + 2;
  if ((long *)*plVar7 == plVar11) {
    local_370 = *plVar11;
    lStack_368 = plVar7[3];
  }
  else {
    local_370 = *plVar11;
    local_380 = (long *)*plVar7;
  }
  local_378 = plVar7[1];
  *plVar7 = (long)plVar11;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  std::__cxx11::string::_M_append((char *)&local_2a0,(ulong)local_380);
  if (local_380 != &local_370) {
    operator_delete(local_380);
  }
  if (local_3a0 != &local_390) {
    operator_delete(local_3a0);
  }
  if (local_b0 != local_a0) {
    operator_delete(local_b0);
  }
  if (local_300 != &local_2f0) {
    operator_delete(local_300);
  }
  if (local_340 != &local_330) {
    operator_delete(local_340);
  }
  if (local_f0 != local_e0) {
    operator_delete(local_f0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_360._M_dataplus._M_p != &local_360.field_2) {
    operator_delete(local_360._M_dataplus._M_p);
  }
  if (local_320 != &local_310) {
    operator_delete(local_320);
  }
  if (local_90 != local_80) {
    operator_delete(local_90);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
    operator_delete(local_2c0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
    operator_delete(local_2e0._M_dataplus._M_p);
  }
  if (local_70 != local_60) {
    operator_delete(local_70);
  }
  if (local_280 != &local_270) {
    operator_delete(local_280);
  }
  if (local_260 != &local_250) {
    operator_delete(local_260);
  }
  if (local_50 != local_40) {
    operator_delete(local_50);
  }
  if (local_220 != &local_210) {
    operator_delete(local_220);
  }
  if (local_1c0 != &local_1b0) {
    operator_delete(local_1c0);
  }
  if (local_d0 != local_c0) {
    operator_delete(local_d0);
  }
  if (local_200 != &local_1f0) {
    operator_delete(local_200);
  }
  if (local_240 != &local_230) {
    operator_delete(local_240);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140._M_dataplus._M_p != &local_140.field_2) {
    operator_delete(local_140._M_dataplus._M_p);
  }
  if (local_1e0 != &local_1d0) {
    operator_delete(local_1e0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180._M_dataplus._M_p != &local_180.field_2) {
    operator_delete(local_180._M_dataplus._M_p);
  }
  std::operator+(&local_2e0,&local_120,&local_160);
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_2e0);
  puVar9 = (ulong *)(plVar7 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar9) {
    local_2c0.field_2._M_allocated_capacity = *puVar9;
    local_2c0.field_2._8_8_ = plVar7[3];
    local_2c0._M_dataplus._M_p = (pointer)&local_2c0.field_2;
  }
  else {
    local_2c0.field_2._M_allocated_capacity = *puVar9;
    local_2c0._M_dataplus._M_p = (pointer)*plVar7;
  }
  local_2c0._M_string_length = plVar7[1];
  *plVar7 = (long)puVar9;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  local_280 = &local_270;
  std::__cxx11::string::_M_construct((ulong)&local_280,'\x03');
  uVar18 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
    uVar18 = local_2c0.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar18 < local_278 + local_2c0._M_string_length) {
    uVar15 = 0xf;
    if (local_280 != &local_270) {
      uVar15 = local_270;
    }
    if (uVar15 < local_278 + local_2c0._M_string_length) goto LAB_00137e90;
    puVar8 = (undefined8 *)
             std::__cxx11::string::replace
                       ((ulong)&local_280,0,(char *)0x0,(ulong)local_2c0._M_dataplus._M_p);
  }
  else {
LAB_00137e90:
    puVar8 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_2c0,(ulong)local_280);
  }
  local_320 = &local_310;
  puVar9 = puVar8 + 2;
  if ((ulong *)*puVar8 == puVar9) {
    local_310 = *puVar9;
    uStack_308 = puVar8[3];
  }
  else {
    local_310 = *puVar9;
    local_320 = (ulong *)*puVar8;
  }
  local_318 = puVar8[1];
  *puVar8 = puVar9;
  puVar8[1] = 0;
  *(undefined1 *)puVar9 = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_320);
  puVar9 = (ulong *)(plVar7 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar9) {
    local_360.field_2._M_allocated_capacity = *puVar9;
    local_360.field_2._8_8_ = plVar7[3];
    local_360._M_dataplus._M_p = (pointer)&local_360.field_2;
  }
  else {
    local_360.field_2._M_allocated_capacity = *puVar9;
    local_360._M_dataplus._M_p = (pointer)*plVar7;
  }
  local_360._M_string_length = plVar7[1];
  *plVar7 = (long)puVar9;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  local_260 = &local_250;
  std::__cxx11::string::_M_construct((ulong)&local_260,'\x03');
  uVar18 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_360._M_dataplus._M_p != &local_360.field_2) {
    uVar18 = local_360.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar18 < local_258 + local_360._M_string_length) {
    uVar15 = 0xf;
    if (local_260 != &local_250) {
      uVar15 = local_250;
    }
    if (uVar15 < local_258 + local_360._M_string_length) goto LAB_00137fc5;
    puVar8 = (undefined8 *)
             std::__cxx11::string::replace
                       ((ulong)&local_260,0,(char *)0x0,(ulong)local_360._M_dataplus._M_p);
  }
  else {
LAB_00137fc5:
    puVar8 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_360,(ulong)local_260);
  }
  local_340 = &local_330;
  puVar9 = puVar8 + 2;
  if ((ulong *)*puVar8 == puVar9) {
    local_330 = *puVar9;
    uStack_328 = puVar8[3];
  }
  else {
    local_330 = *puVar9;
    local_340 = (ulong *)*puVar8;
  }
  local_338 = puVar8[1];
  *puVar8 = puVar9;
  puVar8[1] = 0;
  *(undefined1 *)puVar9 = 0;
  puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_340);
  puVar9 = puVar8 + 2;
  if ((ulong *)*puVar8 == puVar9) {
    local_2f0 = *puVar9;
    uStack_2e8 = puVar8[3];
    local_300 = &local_2f0;
  }
  else {
    local_2f0 = *puVar9;
    local_300 = (ulong *)*puVar8;
  }
  local_2f8 = puVar8[1];
  *puVar8 = puVar9;
  puVar8[1] = 0;
  *(undefined1 *)(puVar8 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::_M_append((char *)&local_300,(ulong)local_2a0);
  puVar9 = (ulong *)(plVar7 + 2);
  if ((ulong *)*plVar7 == puVar9) {
    local_390 = *puVar9;
    lStack_388 = plVar7[3];
    local_3a0 = &local_390;
  }
  else {
    local_390 = *puVar9;
    local_3a0 = (ulong *)*plVar7;
  }
  local_398 = plVar7[1];
  *plVar7 = (long)puVar9;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  local_220 = &local_210;
  std::__cxx11::string::_M_construct((ulong)&local_220,'\x03');
  uVar15 = 0xf;
  if (local_3a0 != &local_390) {
    uVar15 = local_390;
  }
  if (uVar15 < (ulong)(local_218 + local_398)) {
    uVar15 = 0xf;
    if (local_220 != &local_210) {
      uVar15 = local_210;
    }
    if ((ulong)(local_218 + local_398) <= uVar15) {
      puVar8 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_220,0,(char *)0x0,(ulong)local_3a0);
      goto LAB_00138171;
    }
  }
  puVar8 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_3a0,(ulong)local_220);
LAB_00138171:
  local_380 = &local_370;
  plVar7 = puVar8 + 2;
  if ((long *)*puVar8 == plVar7) {
    local_370 = *plVar7;
    lStack_368 = puVar8[3];
  }
  else {
    local_370 = *plVar7;
    local_380 = (long *)*puVar8;
  }
  local_378 = puVar8[1];
  *puVar8 = plVar7;
  puVar8[1] = 0;
  *(undefined1 *)plVar7 = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_380);
  (local_100->_M_dataplus)._M_p = (pointer)&local_100->field_2;
  psVar10 = (size_type *)(plVar7 + 2);
  if ((size_type *)*plVar7 == psVar10) {
    lVar3 = plVar7[3];
    (local_100->field_2)._M_allocated_capacity = *psVar10;
    *(long *)((long)&local_100->field_2 + 8) = lVar3;
  }
  else {
    (local_100->_M_dataplus)._M_p = (pointer)*plVar7;
    (local_100->field_2)._M_allocated_capacity = *psVar10;
  }
  local_100->_M_string_length = plVar7[1];
  *plVar7 = (long)psVar10;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  if (local_380 != &local_370) {
    operator_delete(local_380);
  }
  if (local_220 != &local_210) {
    operator_delete(local_220);
  }
  if (local_3a0 != &local_390) {
    operator_delete(local_3a0);
  }
  if (local_300 != &local_2f0) {
    operator_delete(local_300);
  }
  if (local_340 != &local_330) {
    operator_delete(local_340);
  }
  if (local_260 != &local_250) {
    operator_delete(local_260);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_360._M_dataplus._M_p != &local_360.field_2) {
    operator_delete(local_360._M_dataplus._M_p);
  }
  if (local_320 != &local_310) {
    operator_delete(local_320);
  }
  if (local_280 != &local_270) {
    operator_delete(local_280);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
    operator_delete(local_2c0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
    operator_delete(local_2e0._M_dataplus._M_p);
  }
  if (local_2a0 != &local_290) {
    operator_delete(local_2a0);
  }
  if (local_1a0 != &local_190) {
    operator_delete(local_1a0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160._M_dataplus._M_p != &local_160.field_2) {
    operator_delete(local_160._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120._M_dataplus._M_p != &local_120.field_2) {
    operator_delete(local_120._M_dataplus._M_p);
  }
  return local_100;
}

Assistant:

std::string LinearRegression::generateParameters()
{
    _parameterIndex.resize(NUM_OF_VARIABLES+1);
    
    std::string constructParam = offset(1)+"size_t numberOfParameters;\n"+
        offset(1)+"double stepSize, error, *params = nullptr, *grad = nullptr, "+
        "*lambda = nullptr, *prevParams = nullptr, *prevGrad = nullptr;\n";
    
    std::string constructGrad = "";

    std::string numOfParameters = "numberOfParameters = ";
    size_t numOfContParameters = 1;
    
    // Computing the number of parameters we have
    for (size_t var = 0; var < NUM_OF_VARIABLES; ++var)
    {
        if (!_features.test(var))
            continue;
        if (!_categoricalFeatures.test(var))
        {
            _parameterIndex[var] = numOfContParameters;
            ++numOfContParameters;
        }
        else
        {
            size_t& viewID = parameterQueries[var]->_aggregates[0]->_incoming[0].first;
            numOfParameters += "V"+std::to_string(viewID)+".size() + ";
        }
    }
    _parameterIndex[NUM_OF_VARIABLES] = 0;
    numOfParameters += std::to_string(numOfContParameters+1)+";\n";
    
    std::string initParam = offset(2)+numOfParameters+
        offset(2)+"params = new double[numberOfParameters];\n"+
        offset(2)+"grad = new double[numberOfParameters]();\n"+
        offset(2)+"prevParams = new double[numberOfParameters];\n"+
        offset(2)+"prevGrad = new double[numberOfParameters];\n"+
        offset(2)+"lambda = new double[numberOfParameters];\n";

    // TODO: make sure you initialize the params and grad arrays
    if (_categoricalFeatures.any()) 
        initParam += offset(2)+"size_t categIndex = "+
            std::to_string(numOfContParameters+1)+";\n";
    
    for (size_t var = 0; var < NUM_OF_VARIABLES; ++var)
    {
        if (!_features.test(var))
            continue;

        if (_categoricalFeatures.test(var))
        {
            size_t& viewID = parameterQueries[var]->_aggregates[0]->_incoming[0].first;
            
            constructGrad += offset(1)+"std::unordered_map<int,size_t> index_"+
                getAttributeName(var)+";\n";

            initParam += offset(2)+"index_"+getAttributeName(var)+".reserve(V"+
                std::to_string(viewID)+".size());\n";
            // offset(2)+"firstindex_"+getAttributeName(var)+" = categIndex;\n";

            initParam += offset(2)+"for (V"+std::to_string(viewID)+
                "_tuple& tuple : V"+
                std::to_string(viewID)+")\n"+
                offset(3)+"index_"+getAttributeName(var)+
                "[tuple."+getAttributeName(var)+"] = categIndex++;\n";
        }
    }

    initParam += offset(2)+"for(size_t j = 0; j < numberOfParameters; ++j)\n"+
        offset(2)+"{\n"+
        offset(3)+"params[j] = ((double) (rand() % 800 + 1) - 400) / 100;\n"+
        offset(3)+"lambda[j] = 0.1;\n"+
        offset(2)+"}\n"+
        offset(2)+"params["+std::to_string(_parameterIndex[labelID])+"] = -1;\n"+
        offset(2)+"lambda[0] = 0.0;\n";
    
    std::string outString = constructParam+constructGrad+"\n"+
        offset(1)+"void initParametersGradients()\n"+
        offset(1)+"{\n"+initParam+offset(1)+"}\n";
    
    return outString;
}